

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void fread_to_eol(FILE *fp)

{
  char cVar1;
  int iVar2;
  FILE *in_RDI;
  char c;
  bool local_b;
  bool local_a;
  
  do {
    iVar2 = getc(in_RDI);
    local_a = (char)iVar2 != '\n' && (char)iVar2 != '\r';
  } while (local_a);
  do {
    iVar2 = getc(in_RDI);
    cVar1 = (char)iVar2;
    local_b = cVar1 == '\n' || cVar1 == '\r';
  } while (local_b);
  ungetc((int)cVar1,in_RDI);
  return;
}

Assistant:

void fread_to_eol(FILE *fp)
{
	char c;

	do
	{
		c = getc(fp);
	} while (c != '\n' && c != '\r');

	do
	{
		c = getc(fp);
	} while (c == '\n' || c == '\r');

	ungetc(c, fp);
}